

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O3

IterateResult __thiscall
dit::anon_unknown_0::SeedBuilderTest<tcu::Vector<int,_3>_>::iterate
          (SeedBuilderTest<tcu::Vector<int,_3>_> *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  char *description;
  int i;
  long lVar3;
  bool bVar4;
  SeedBuilder builder;
  SeedBuilder local_1ac;
  undefined1 local_1a8 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::SeedBuilder::SeedBuilder(&local_1ac);
  lVar3 = 0;
  do {
    tcu::operator<<(&local_1ac,(this->m_value).m_data[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value: ",7);
  tcu::operator<<((ostream *)poVar1,&this->m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected seed: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Got seed: ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  bVar4 = local_1ac.m_hash != this->m_seed;
  if (bVar4) {
    description = "Got invalid seed";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)bVar4,description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log		= m_testCtx.getLog();
		tcu::SeedBuilder	builder;

		builder << m_value;

		log << TestLog::Message << "Value: " << m_value << TestLog::EndMessage;
		log << TestLog::Message << "Expected seed: " << m_seed << TestLog::EndMessage;
		log << TestLog::Message << "Got seed: " << builder.get() << TestLog::EndMessage;

		if (builder.get() != m_seed)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid seed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}